

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

void test_bson_iter_utf8(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_t *pbVar6;
  long lVar7;
  bson_t *pbVar8;
  undefined4 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined8 *puVar12;
  bson_t *pbVar13;
  bson_t *pbVar14;
  bson_t *pbVar15;
  TestSuite *suite;
  ulong uVar16;
  char *unaff_R14;
  undefined1 *puVar17;
  char *unaff_R15;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint32_t len;
  bson_iter_t iter;
  undefined1 auStack_3498 [4104];
  bson_t *pbStack_2490;
  code *pcStack_2488;
  undefined8 uStack_2410;
  undefined1 uStack_2408;
  TestSuite aTStack_2400 [5];
  code *pcStack_2308;
  int *piStack_2290;
  int iStack_2288;
  undefined1 auStack_2284 [4];
  undefined1 auStack_2280 [232];
  bson_t *pbStack_2198;
  undefined1 *puStack_2190;
  code *pcStack_2188;
  bson_t bStack_2180;
  bson_t abStack_2100 [2];
  undefined8 uStack_1fc8;
  char *pcStack_1fc0;
  bson_t *pbStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  bson_t *pbStack_1fa0;
  char *pcStack_1f98;
  char *pcStack_1f90;
  code *pcStack_1f88;
  undefined1 auStack_1f80 [128];
  undefined1 auStack_1f00 [232];
  undefined1 *puStack_1e18;
  undefined1 *puStack_1e10;
  code *pcStack_1e08;
  undefined1 auStack_1e00 [128];
  undefined1 auStack_1d80 [368];
  undefined1 *puStack_1c10;
  code *pcStack_1c08;
  undefined1 auStack_1c00 [128];
  undefined1 auStack_1b80 [128];
  undefined1 auStack_1b00 [128];
  undefined1 auStack_1a80 [368];
  undefined8 *puStack_1910;
  code *apcStack_1908 [13];
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined1 auStack_1890 [16];
  undefined8 auStack_1880 [14];
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined1 auStack_1800 [360];
  undefined1 *puStack_1698;
  undefined1 *puStack_1690;
  code *pcStack_1688;
  undefined1 auStack_1680 [128];
  undefined1 auStack_1600 [368];
  undefined1 *puStack_1490;
  code *pcStack_1488;
  undefined1 auStack_1480 [128];
  undefined1 auStack_1400 [368];
  undefined1 *puStack_1290;
  code *pcStack_1288;
  undefined1 auStack_1280 [128];
  undefined1 auStack_1200 [368];
  undefined1 *puStack_1090;
  code *pcStack_1088;
  undefined1 auStack_1080 [128];
  undefined1 auStack_1000 [368];
  undefined1 *puStack_e90;
  code *pcStack_e88;
  undefined1 auStack_e80 [128];
  undefined1 auStack_e00 [368];
  undefined1 *puStack_c90;
  code *pcStack_c88;
  undefined1 auStack_c80 [128];
  undefined1 auStack_c00 [368];
  undefined8 uStack_a90;
  code *pcStack_a88;
  undefined1 auStack_a80 [224];
  undefined8 uStack_9a0;
  undefined1 *puStack_998;
  undefined8 uStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [240];
  undefined1 *puStack_890;
  code *apcStack_888 [15];
  uint uStack_80c;
  uint *puStack_808;
  undefined1 auStack_800 [8];
  uint uStack_7f8;
  int iStack_7f4;
  uint uStack_7d8;
  bson_t *pbStack_6b0;
  code *pcStack_688;
  undefined1 auStack_680 [240];
  bson_t *pbStack_590;
  code *apcStack_588 [15];
  long lStack_510;
  long lStack_508;
  undefined1 auStack_500 [232];
  bson_t *pbStack_418;
  undefined8 uStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [240];
  bson_t *pbStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [184];
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined1 auStack_238 [152];
  undefined8 uStack_1a0;
  char *pcStack_198;
  char *pcStack_190;
  code *apcStack_188 [16];
  int local_104;
  undefined1 local_100 [224];
  
  local_104 = 0;
  apcStack_188[0] = (code *)0x12a4f1;
  uVar4 = bson_new();
  apcStack_188[0] = (code *)0x12a515;
  cVar1 = bson_append_utf8(uVar4,"foo",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    apcStack_188[0] = (code *)0x12a6b0;
    test_bson_iter_utf8_cold_1();
LAB_0012a6b0:
    apcStack_188[0] = (code *)0x12a6b5;
    test_bson_iter_utf8_cold_2();
LAB_0012a6b5:
    apcStack_188[0] = (code *)0x12a6ba;
    test_bson_iter_utf8_cold_3();
LAB_0012a6ba:
    apcStack_188[0] = (code *)0x12a6bf;
    test_bson_iter_utf8_cold_4();
LAB_0012a6bf:
    apcStack_188[0] = (code *)0x12a6c4;
    test_bson_iter_utf8_cold_5();
LAB_0012a6c4:
    apcStack_188[0] = (code *)0x12a6c9;
    test_bson_iter_utf8_cold_6();
LAB_0012a6c9:
    apcStack_188[0] = (code *)0x12a6ce;
    test_bson_iter_utf8_cold_7();
LAB_0012a6ce:
    apcStack_188[0] = (code *)0x12a6d3;
    test_bson_iter_utf8_cold_10();
LAB_0012a6d3:
    apcStack_188[0] = (code *)0x12a6d8;
    test_bson_iter_utf8_cold_11();
LAB_0012a6d8:
    apcStack_188[0] = (code *)0x12a6dd;
    test_bson_iter_utf8_cold_12();
LAB_0012a6dd:
    apcStack_188[0] = (code *)0x12a6e2;
    test_bson_iter_utf8_cold_13();
LAB_0012a6e2:
    apcStack_188[0] = (code *)0x12a6e7;
    test_bson_iter_utf8_cold_14();
LAB_0012a6e7:
    apcStack_188[0] = (code *)0x12a6ec;
    test_bson_iter_utf8_cold_9();
  }
  else {
    apcStack_188[0] = (code *)0x12a53e;
    cVar1 = bson_append_utf8(uVar4,"bar",0xffffffff,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012a6b0;
    apcStack_188[0] = (code *)0x12a556;
    cVar1 = bson_iter_init(local_100,uVar4);
    if (cVar1 == '\0') goto LAB_0012a6b5;
    apcStack_188[0] = (code *)0x12a56b;
    cVar1 = bson_iter_next(local_100);
    if (cVar1 == '\0') goto LAB_0012a6ba;
    apcStack_188[0] = (code *)0x12a580;
    iVar2 = bson_iter_type(local_100);
    if (iVar2 != 2) goto LAB_0012a6bf;
    apcStack_188[0] = (code *)0x12a596;
    pcVar5 = (char *)bson_iter_key(local_100);
    apcStack_188[0] = (code *)0x12a5a5;
    iVar2 = strcmp(pcVar5,"foo");
    if (iVar2 != 0) goto LAB_0012a6c4;
    apcStack_188[0] = (code *)0x12a5bc;
    pcVar5 = (char *)bson_iter_utf8(local_100,0);
    unaff_R15 = "bar";
    apcStack_188[0] = (code *)0x12a5ce;
    iVar2 = strcmp(pcVar5,"bar");
    if (iVar2 != 0) goto LAB_0012a6c9;
    apcStack_188[0] = (code *)0x12a5e8;
    unaff_R14 = (char *)bson_iter_dup_utf8(local_100,&local_104);
    if (unaff_R14 == "bar") {
LAB_0012a607:
      if (local_104 == 3) {
        apcStack_188[0] = (code *)0x12a61a;
        bson_free(unaff_R14);
        apcStack_188[0] = (code *)0x12a627;
        cVar1 = bson_iter_next(local_100);
        if (cVar1 == '\0') goto LAB_0012a6ce;
        apcStack_188[0] = (code *)0x12a63c;
        iVar2 = bson_iter_type(local_100);
        if (iVar2 != 2) goto LAB_0012a6d3;
        apcStack_188[0] = (code *)0x12a652;
        pcVar5 = (char *)bson_iter_key(local_100);
        apcStack_188[0] = (code *)0x12a661;
        iVar2 = strcmp(pcVar5,"bar");
        if (iVar2 != 0) goto LAB_0012a6d8;
        apcStack_188[0] = (code *)0x12a674;
        pcVar5 = (char *)bson_iter_utf8(local_100,0);
        apcStack_188[0] = (code *)0x12a683;
        iVar2 = strcmp(pcVar5,"baz");
        if (iVar2 != 0) goto LAB_0012a6dd;
        apcStack_188[0] = (code *)0x12a694;
        cVar1 = bson_iter_next(local_100);
        if (cVar1 == '\0') {
          apcStack_188[0] = (code *)0x12a6a0;
          bson_destroy(uVar4);
          return;
        }
        goto LAB_0012a6e2;
      }
      goto LAB_0012a6e7;
    }
    apcStack_188[0] = (code *)0x12a5ff;
    iVar2 = strcmp("bar",unaff_R14);
    if (iVar2 == 0) goto LAB_0012a607;
  }
  apcStack_188[0] = test_bson_iter_mixed;
  test_bson_iter_utf8_cold_8();
  pcStack_308 = (code *)0x12a70d;
  uStack_1a0 = uVar4;
  pcStack_198 = unaff_R14;
  pcStack_190 = unaff_R15;
  apcStack_188[0] = (code *)&stack0xfffffffffffffff8;
  pbVar6 = (bson_t *)bson_new();
  pcStack_308 = (code *)0x12a715;
  uVar4 = bson_new();
  uStack_240 = 0;
  uStack_248 = 1;
  pcStack_308 = (code *)0x12a751;
  cVar1 = bson_append_utf8(uVar4,"foo",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x12aa1c;
    test_bson_iter_mixed_cold_1();
LAB_0012aa1c:
    pcStack_308 = (code *)0x12aa21;
    test_bson_iter_mixed_cold_2();
LAB_0012aa21:
    pcStack_308 = (code *)0x12aa26;
    test_bson_iter_mixed_cold_3();
LAB_0012aa26:
    pcStack_308 = (code *)0x12aa2b;
    test_bson_iter_mixed_cold_4();
LAB_0012aa2b:
    pcStack_308 = (code *)0x12aa30;
    test_bson_iter_mixed_cold_5();
LAB_0012aa30:
    pcStack_308 = (code *)0x12aa35;
    test_bson_iter_mixed_cold_6();
LAB_0012aa35:
    pcStack_308 = (code *)0x12aa3a;
    test_bson_iter_mixed_cold_7();
LAB_0012aa3a:
    pcStack_308 = (code *)0x12aa3f;
    test_bson_iter_mixed_cold_8();
LAB_0012aa3f:
    pcStack_308 = (code *)0x12aa44;
    test_bson_iter_mixed_cold_9();
LAB_0012aa44:
    pcStack_308 = (code *)0x12aa49;
    test_bson_iter_mixed_cold_10();
LAB_0012aa49:
    pcStack_308 = (code *)0x12aa4e;
    test_bson_iter_mixed_cold_11();
LAB_0012aa4e:
    pcStack_308 = (code *)0x12aa53;
    test_bson_iter_mixed_cold_12();
LAB_0012aa53:
    pcStack_308 = (code *)0x12aa58;
    test_bson_iter_mixed_cold_13();
LAB_0012aa58:
    pcStack_308 = (code *)0x12aa5d;
    test_bson_iter_mixed_cold_14();
LAB_0012aa5d:
    pcStack_308 = (code *)0x12aa62;
    test_bson_iter_mixed_cold_15();
LAB_0012aa62:
    pcStack_308 = (code *)0x12aa67;
    test_bson_iter_mixed_cold_16();
LAB_0012aa67:
    pcStack_308 = (code *)0x12aa6c;
    test_bson_iter_mixed_cold_17();
LAB_0012aa6c:
    pcStack_308 = (code *)0x12aa71;
    test_bson_iter_mixed_cold_18();
LAB_0012aa71:
    pcStack_308 = (code *)0x12aa76;
    test_bson_iter_mixed_cold_19();
LAB_0012aa76:
    pcStack_308 = (code *)0x12aa7b;
    test_bson_iter_mixed_cold_20();
LAB_0012aa7b:
    pcStack_308 = (code *)0x12aa80;
    test_bson_iter_mixed_cold_31();
LAB_0012aa80:
    pcStack_308 = (code *)0x12aa85;
    test_bson_iter_mixed_cold_21();
LAB_0012aa85:
    pcStack_308 = (code *)0x12aa8a;
    test_bson_iter_mixed_cold_22();
LAB_0012aa8a:
    pcStack_308 = (code *)0x12aa8f;
    test_bson_iter_mixed_cold_23();
LAB_0012aa8f:
    pcStack_308 = (code *)0x12aa94;
    test_bson_iter_mixed_cold_24();
LAB_0012aa94:
    pcStack_308 = (code *)0x12aa99;
    test_bson_iter_mixed_cold_25();
LAB_0012aa99:
    pcStack_308 = (code *)0x12aa9e;
    test_bson_iter_mixed_cold_26();
LAB_0012aa9e:
    pcStack_308 = (code *)0x12aaa3;
    test_bson_iter_mixed_cold_27();
LAB_0012aaa3:
    pcStack_308 = (code *)0x12aaa8;
    test_bson_iter_mixed_cold_28();
LAB_0012aaa8:
    pcStack_308 = (code *)0x12aaad;
    test_bson_iter_mixed_cold_29();
  }
  else {
    pcStack_308 = (code *)0x12a774;
    cVar1 = bson_append_code(pbVar6,"0",0xffffffff,"var a = {};");
    if (cVar1 == '\0') goto LAB_0012aa1c;
    pcStack_308 = (code *)0x12a79a;
    cVar1 = bson_append_code_with_scope(pbVar6,"1",0xffffffff,"var b = {};",uVar4);
    if (cVar1 == '\0') goto LAB_0012aa21;
    pcStack_308 = (code *)0x12a7bb;
    cVar1 = bson_append_int32(pbVar6,"2",0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012aa26;
    pcStack_308 = (code *)0x12a7dc;
    cVar1 = bson_append_int64(pbVar6,"3",0xffffffff,0x11d7);
    if (cVar1 == '\0') goto LAB_0012aa2b;
    pcStack_308 = (code *)0x12a7fd;
    cVar1 = bson_append_time_t(pbVar6,"4",0xffffffff,0x1e240);
    if (cVar1 == '\0') goto LAB_0012aa30;
    pcStack_308 = (code *)0x12a821;
    cVar1 = bson_append_decimal128(pbVar6,"5",0xffffffff,&uStack_248);
    if (cVar1 == '\0') goto LAB_0012aa35;
    pcStack_308 = (code *)0x12a834;
    cVar1 = bson_iter_init(auStack_300,pbVar6);
    if (cVar1 == '\0') goto LAB_0012aa3a;
    pcStack_308 = (code *)0x12a844;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa3f;
    pcStack_308 = (code *)0x12a854;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0xd) goto LAB_0012aa44;
    pcStack_308 = (code *)0x12a865;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa49;
    pcStack_308 = (code *)0x12a875;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0xf) goto LAB_0012aa4e;
    pcStack_308 = (code *)0x12a886;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa53;
    pcStack_308 = (code *)0x12a896;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x10) goto LAB_0012aa58;
    pcStack_308 = (code *)0x12a8a7;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa5d;
    pcStack_308 = (code *)0x12a8b7;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x12) goto LAB_0012aa62;
    pcStack_308 = (code *)0x12a8c8;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa67;
    pcStack_308 = (code *)0x12a8d8;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 9) goto LAB_0012aa6c;
    pcStack_308 = (code *)0x12a8e9;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa71;
    pcStack_308 = (code *)0x12a8f9;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x13) goto LAB_0012aa76;
    pcStack_308 = (code *)0x12a90a;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 != '\0') goto LAB_0012aa7b;
    pcStack_308 = (code *)0x12a924;
    cVar1 = bson_iter_init_find(auStack_300,pbVar6,"3");
    if (cVar1 == '\0') goto LAB_0012aa80;
    pcStack_308 = (code *)0x12a934;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    pcStack_308 = (code *)0x12a943;
    iVar2 = strcmp(pcVar5,"3");
    if (iVar2 != 0) goto LAB_0012aa85;
    pcStack_308 = (code *)0x12a953;
    lVar7 = bson_iter_int64(auStack_300);
    if (lVar7 != 0x11d7) goto LAB_0012aa8a;
    pcStack_308 = (code *)0x12a967;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aa8f;
    pcStack_308 = (code *)0x12a977;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 9) goto LAB_0012aa94;
    pcStack_308 = (code *)0x12a988;
    lVar7 = bson_iter_time_t(auStack_300);
    if (lVar7 != 0x1e240) goto LAB_0012aa99;
    pcStack_308 = (code *)0x12a99c;
    lVar7 = bson_iter_date_time(auStack_300);
    if (lVar7 != 0x75bca00) goto LAB_0012aa9e;
    pcStack_308 = (code *)0x12a9b0;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012aaa3;
    pcStack_308 = (code *)0x12a9cb;
    bson_iter_decimal128(auStack_300,auStack_238);
    auVar20[0] = -((char)uStack_248 == auStack_238[0]);
    auVar20[1] = -(uStack_248._1_1_ == auStack_238[1]);
    auVar20[2] = -(uStack_248._2_1_ == auStack_238[2]);
    auVar20[3] = -(uStack_248._3_1_ == auStack_238[3]);
    auVar20[4] = -(uStack_248._4_1_ == auStack_238[4]);
    auVar20[5] = -(uStack_248._5_1_ == auStack_238[5]);
    auVar20[6] = -(uStack_248._6_1_ == auStack_238[6]);
    auVar20[7] = -(uStack_248._7_1_ == auStack_238[7]);
    auVar20[8] = -((char)uStack_240 == auStack_238[8]);
    auVar20[9] = -(uStack_240._1_1_ == auStack_238[9]);
    auVar20[10] = -(uStack_240._2_1_ == auStack_238[10]);
    auVar20[0xb] = -(uStack_240._3_1_ == auStack_238[0xb]);
    auVar20[0xc] = -(uStack_240._4_1_ == auStack_238[0xc]);
    auVar20[0xd] = -(uStack_240._5_1_ == auStack_238[0xd]);
    auVar20[0xe] = -(uStack_240._6_1_ == auStack_238[0xe]);
    auVar20[0xf] = -(uStack_240._7_1_ == auStack_238[0xf]);
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_0012aaa8;
    pcStack_308 = (code *)0x12a9f4;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') {
      pcStack_308 = (code *)0x12aa04;
      bson_destroy(pbVar6);
      pcStack_308 = (code *)0x12aa0c;
      bson_destroy(uVar4);
      return;
    }
  }
  pcStack_308 = test_bson_iter_overflow;
  test_bson_iter_mixed_cold_30();
  pcStack_408 = (code *)0x12aace;
  pbStack_310 = pbVar6;
  pcStack_308 = (code *)apcStack_188;
  pbVar8 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow1.bson"
                   );
  if (pbVar8 == (bson_t *)0x0) {
    pcStack_408 = (code *)0x12aadf;
    pbVar8 = get_bson(
                     "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow2.bson"
                     );
    if (pbVar8 == (bson_t *)0x0) goto LAB_0012ab16;
    pcStack_408 = (code *)0x12aaf2;
    cVar1 = bson_iter_init(auStack_400,pbVar8);
    pbVar6 = pbVar8;
    if (cVar1 == '\0') goto LAB_0012ab1b;
    pcStack_408 = (code *)0x12aafe;
    cVar1 = bson_iter_next(auStack_400);
    if (cVar1 == '\0') {
      pcStack_408 = (code *)0x12ab0a;
      bson_destroy(pbVar8);
      return;
    }
  }
  else {
    pcStack_408 = (code *)0x12ab16;
    test_bson_iter_overflow_cold_1();
LAB_0012ab16:
    pcStack_408 = (code *)0x12ab1b;
    test_bson_iter_overflow_cold_4();
LAB_0012ab1b:
    pcStack_408 = (code *)0x12ab20;
    test_bson_iter_overflow_cold_2();
  }
  pcStack_408 = test_bson_iter_timeval;
  test_bson_iter_overflow_cold_3();
  apcStack_588[0] = (code *)0x12ab43;
  pbStack_418 = pbVar6;
  uStack_410 = uVar4;
  pcStack_408 = (code *)&pcStack_308;
  pbVar8 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test26.bson"
                   );
  if (pbVar8 == (bson_t *)0x0) {
    apcStack_588[0] = (code *)0x12abac;
    test_bson_iter_timeval_cold_5();
LAB_0012abac:
    apcStack_588[0] = (code *)0x12abb1;
    test_bson_iter_timeval_cold_1();
LAB_0012abb1:
    apcStack_588[0] = (code *)0x12abb6;
    test_bson_iter_timeval_cold_2();
LAB_0012abb6:
    apcStack_588[0] = (code *)0x12abbb;
    test_bson_iter_timeval_cold_3();
  }
  else {
    apcStack_588[0] = (code *)0x12ab5b;
    cVar1 = bson_iter_init(auStack_500,pbVar8);
    pbVar6 = pbVar8;
    if (cVar1 == '\0') goto LAB_0012abac;
    apcStack_588[0] = (code *)0x12ab6c;
    cVar1 = bson_iter_next(auStack_500);
    if (cVar1 == '\0') goto LAB_0012abb1;
    apcStack_588[0] = (code *)0x12ab85;
    bson_iter_timeval(auStack_500,&lStack_510);
    if (lStack_510 != 0x499602d2) goto LAB_0012abb6;
    if (lStack_508 == 0) {
      apcStack_588[0] = (code *)0x12ab9e;
      bson_destroy(pbVar8);
      return;
    }
  }
  apcStack_588[0] = test_bson_iter_trailing_null;
  test_bson_iter_timeval_cold_4();
  pcStack_688 = (code *)0x12abdc;
  pbStack_590 = pbVar6;
  apcStack_588[0] = (code *)&pcStack_408;
  pbVar8 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/trailingnull.bson"
                   );
  if (pbVar8 == (bson_t *)0x0) {
    pcStack_688 = (code *)0x12ac13;
    test_bson_iter_trailing_null_cold_3();
  }
  else {
    pcStack_688 = (code *)0x12abef;
    cVar1 = bson_iter_init(auStack_680,pbVar8);
    pbVar6 = pbVar8;
    if (cVar1 != '\0') {
      pcStack_688 = (code *)0x12abfb;
      cVar1 = bson_iter_next(auStack_680);
      if (cVar1 == '\0') {
        pcStack_688 = (code *)0x12ac07;
        bson_destroy(pbVar8);
        return;
      }
      goto LAB_0012ac18;
    }
  }
  pcStack_688 = (code *)0x12ac18;
  test_bson_iter_trailing_null_cold_1();
LAB_0012ac18:
  pcStack_688 = test_bson_iter_fuzz;
  test_bson_iter_trailing_null_cold_2();
  puVar17 = (undefined1 *)0x0;
  uVar18 = 0xfff66;
  pbStack_6b0 = pbVar6;
  pcStack_688 = (code *)apcStack_588;
  do {
    apcStack_888[0] = (code *)0x12ac50;
    puVar9 = (undefined4 *)bson_malloc0(0x200);
    *puVar9 = 0x200;
    uVar16 = 0;
    do {
      apcStack_888[0] = (code *)0x12ac61;
      iVar2 = rand();
      *(int *)((long)puVar9 + uVar16 + 4) = iVar2;
      uVar16 = uVar16 + 4;
    } while (uVar16 < 0x1fc);
    apcStack_888[0] = (code *)0x12ac80;
    lVar7 = bson_new_from_data(puVar9,0x200);
    if (lVar7 != 0) {
      apcStack_888[0] = (code *)0x12ac97;
      cVar1 = bson_iter_init(auStack_800,lVar7);
      if (cVar1 == '\0') {
LAB_0012adbb:
        apcStack_888[0] = (code *)0x12adc0;
        test_bson_iter_fuzz_cold_1();
LAB_0012adc0:
        apcStack_888[0] = (code *)0x12adc5;
        test_bson_iter_fuzz_cold_8();
LAB_0012adc5:
        apcStack_888[0] = (code *)0x12adca;
        test_bson_iter_fuzz_cold_4();
LAB_0012adca:
        apcStack_888[0] = (code *)0x12adcf;
        test_bson_iter_fuzz_cold_5();
LAB_0012adcf:
        apcStack_888[0] = (code *)0x12add4;
        test_bson_iter_fuzz_cold_7();
LAB_0012add4:
        apcStack_888[0] = (code *)0x12add9;
        test_bson_iter_fuzz_cold_6();
LAB_0012add9:
        apcStack_888[0] = (code *)0x12adde;
        test_bson_iter_fuzz_cold_3();
LAB_0012adde:
        apcStack_888[0] = test_bson_iter_regex;
        test_bson_iter_fuzz_cold_9();
        pcStack_988 = (code *)0x12adf8;
        puStack_890 = auStack_800;
        apcStack_888[0] = (code *)&pcStack_688;
        uVar4 = bson_new();
        pcStack_988 = (code *)0x12ae1d;
        cVar1 = bson_append_regex(uVar4,"foo",0xffffffff,"^abcd","");
        if (cVar1 == '\0') {
          pcStack_988 = (code *)0x12aeb4;
          test_bson_iter_regex_cold_1();
LAB_0012aeb4:
          pcStack_988 = (code *)0x12aeb9;
          test_bson_iter_regex_cold_2();
LAB_0012aeb9:
          pcStack_988 = (code *)0x12aebe;
          test_bson_iter_regex_cold_3();
LAB_0012aebe:
          pcStack_988 = (code *)0x12aec3;
          test_bson_iter_regex_cold_4();
LAB_0012aec3:
          pcStack_988 = (code *)0x12aec8;
          test_bson_iter_regex_cold_5();
LAB_0012aec8:
          pcStack_988 = (code *)0x12aecd;
          test_bson_iter_regex_cold_6();
        }
        else {
          pcStack_988 = (code *)0x12ae43;
          cVar1 = bson_append_regex(uVar4,"foo",0xffffffff,"^abcd",0);
          if (cVar1 == '\0') goto LAB_0012aeb4;
          pcStack_988 = (code *)0x12ae69;
          cVar1 = bson_append_regex(uVar4,"foo",0xffffffff,"^abcd","ix");
          if (cVar1 == '\0') goto LAB_0012aeb9;
          pcStack_988 = (code *)0x12ae78;
          cVar1 = bson_iter_init(auStack_980,uVar4);
          if (cVar1 == '\0') goto LAB_0012aebe;
          pcStack_988 = (code *)0x12ae84;
          cVar1 = bson_iter_next(auStack_980);
          if (cVar1 == '\0') goto LAB_0012aec3;
          pcStack_988 = (code *)0x12ae90;
          cVar1 = bson_iter_next(auStack_980);
          if (cVar1 == '\0') goto LAB_0012aec8;
          pcStack_988 = (code *)0x12ae9c;
          cVar1 = bson_iter_next(auStack_980);
          if (cVar1 != '\0') {
            pcStack_988 = (code *)0x12aea8;
            bson_destroy(uVar4);
            return;
          }
        }
        pcStack_988 = test_bson_iter_next_after_finish;
        test_bson_iter_regex_cold_7();
        uStack_990 = 0xfff66;
        pcStack_a88 = (code *)0x12aeeb;
        uStack_9a0 = uVar4;
        puStack_998 = puVar17;
        pcStack_988 = (code *)apcStack_888;
        uVar4 = bson_new();
        pcStack_a88 = (code *)0x12af07;
        cVar1 = bson_append_int32(uVar4,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') goto LAB_0012af58;
        pcStack_a88 = (code *)0x12af16;
        cVar1 = bson_iter_init(auStack_a80,uVar4);
        if (cVar1 == '\0') goto LAB_0012af5d;
        pcStack_a88 = (code *)0x12af22;
        cVar1 = bson_iter_next(auStack_a80);
        if (cVar1 != '\0') {
          uVar18 = 1000;
          while( true ) {
            pcStack_a88 = (code *)0x12af37;
            cVar1 = bson_iter_next(auStack_a80);
            if (cVar1 != '\0') break;
            uVar3 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar3;
            if (uVar3 == 0) {
              pcStack_a88 = (code *)0x12af48;
              bson_destroy(uVar4);
              return;
            }
          }
          pcStack_a88 = (code *)0x12af58;
          test_bson_iter_next_after_finish_cold_4();
          puVar17 = auStack_a80;
LAB_0012af58:
          pcStack_a88 = (code *)0x12af5d;
          test_bson_iter_next_after_finish_cold_1();
LAB_0012af5d:
          pcStack_a88 = (code *)0x12af62;
          test_bson_iter_next_after_finish_cold_2();
        }
        pcStack_a88 = test_bson_iter_find_case;
        test_bson_iter_next_after_finish_cold_3();
        pcStack_c88 = (code *)0x12af87;
        uStack_a90 = uVar4;
        pcStack_a88 = (code *)&pcStack_988;
        bson_init(auStack_c00);
        pcStack_c88 = (code *)0x12afa8;
        cVar1 = bson_append_utf8(auStack_c00,"key",0xffffffff,"value",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_c88 = (code *)0x12b013;
          test_bson_iter_find_case_cold_1();
LAB_0012b013:
          pcStack_c88 = (code *)0x12b018;
          test_bson_iter_find_case_cold_2();
LAB_0012b018:
          pcStack_c88 = (code *)0x12b01d;
          test_bson_iter_find_case_cold_3();
LAB_0012b01d:
          pcStack_c88 = (code *)0x12b022;
          test_bson_iter_find_case_cold_4();
        }
        else {
          pcStack_c88 = (code *)0x12afbc;
          cVar1 = bson_iter_init(auStack_c80,auStack_c00);
          if (cVar1 == '\0') goto LAB_0012b013;
          pcStack_c88 = (code *)0x12afcf;
          cVar1 = bson_iter_find_case(auStack_c80,"KEY");
          if (cVar1 == '\0') goto LAB_0012b018;
          pcStack_c88 = (code *)0x12afe3;
          cVar1 = bson_iter_init(auStack_c80,auStack_c00);
          if (cVar1 == '\0') goto LAB_0012b01d;
          pcStack_c88 = (code *)0x12aff6;
          cVar1 = bson_iter_find(auStack_c80,"KEY");
          if (cVar1 == '\0') {
            pcStack_c88 = (code *)0x12b007;
            bson_destroy(auStack_c00);
            return;
          }
        }
        pcStack_c88 = test_bson_iter_as_double;
        test_bson_iter_find_case_cold_5();
        pcStack_e88 = (code *)0x12b047;
        puStack_c90 = auStack_c00;
        pcStack_c88 = (code *)&pcStack_a88;
        bson_init(auStack_e00);
        pcStack_e88 = (code *)0x12b063;
        cVar1 = bson_append_double(0x4093487e5c91d14e,auStack_e00,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_e88 = (code *)0x12b1c6;
          test_bson_iter_as_double_cold_1();
LAB_0012b1c6:
          pcStack_e88 = (code *)0x12b1cb;
          test_bson_iter_as_double_cold_2();
LAB_0012b1cb:
          pcStack_e88 = (code *)0x12b1d0;
          test_bson_iter_as_double_cold_3();
LAB_0012b1d0:
          pcStack_e88 = (code *)0x12b1d5;
          test_bson_iter_as_double_cold_4();
LAB_0012b1d5:
          pcStack_e88 = (code *)0x12b1da;
          test_bson_iter_as_double_cold_5();
LAB_0012b1da:
          pcStack_e88 = (code *)0x12b1df;
          test_bson_iter_as_double_cold_6();
LAB_0012b1df:
          pcStack_e88 = (code *)0x12b1e4;
          test_bson_iter_as_double_cold_7();
LAB_0012b1e4:
          pcStack_e88 = (code *)0x12b1e9;
          test_bson_iter_as_double_cold_8();
LAB_0012b1e9:
          pcStack_e88 = (code *)0x12b1ee;
          test_bson_iter_as_double_cold_9();
LAB_0012b1ee:
          pcStack_e88 = (code *)0x12b1f3;
          test_bson_iter_as_double_cold_10();
LAB_0012b1f3:
          pcStack_e88 = (code *)0x12b1f8;
          test_bson_iter_as_double_cold_11();
        }
        else {
          pcStack_e88 = (code *)0x12b082;
          cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
          if (cVar1 == '\0') goto LAB_0012b1c6;
          pcStack_e88 = (code *)0x12b092;
          iVar2 = bson_iter_type(auStack_e80);
          if (iVar2 != 1) goto LAB_0012b1cb;
          pcStack_e88 = (code *)0x12b0a3;
          dVar19 = (double)bson_iter_as_double(auStack_e80);
          if ((dVar19 != 1234.1234) || (NAN(dVar19))) goto LAB_0012b1d0;
          pcStack_e88 = (code *)0x12b0c7;
          bson_destroy(auStack_e00);
          pcStack_e88 = (code *)0x12b0cf;
          bson_init(auStack_e00);
          pcStack_e88 = (code *)0x12b0e8;
          cVar1 = bson_append_int32(auStack_e00,"key",0xffffffff,0x4d2);
          if (cVar1 == '\0') goto LAB_0012b1d5;
          pcStack_e88 = (code *)0x12b107;
          cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
          if (cVar1 == '\0') goto LAB_0012b1da;
          pcStack_e88 = (code *)0x12b117;
          iVar2 = bson_iter_type(auStack_e80);
          if (iVar2 != 0x10) goto LAB_0012b1df;
          pcStack_e88 = (code *)0x12b128;
          dVar19 = (double)bson_iter_as_double(auStack_e80);
          if ((dVar19 != 1234.0) || (NAN(dVar19))) goto LAB_0012b1e4;
          pcStack_e88 = (code *)0x12b14c;
          bson_destroy(auStack_e00);
          pcStack_e88 = (code *)0x12b154;
          bson_init(auStack_e00);
          pcStack_e88 = (code *)0x12b16d;
          cVar1 = bson_append_int64(auStack_e00,"key",0xffffffff,0x10e1);
          if (cVar1 == '\0') goto LAB_0012b1e9;
          pcStack_e88 = (code *)0x12b188;
          cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
          if (cVar1 == '\0') goto LAB_0012b1ee;
          pcStack_e88 = (code *)0x12b194;
          iVar2 = bson_iter_type(auStack_e80);
          if (iVar2 != 0x12) goto LAB_0012b1f3;
          pcStack_e88 = (code *)0x12b1a1;
          dVar19 = (double)bson_iter_as_double(auStack_e80);
          if ((dVar19 == 4321.0) && (!NAN(dVar19))) {
            pcStack_e88 = (code *)0x12b1ba;
            bson_destroy(auStack_e00);
            return;
          }
        }
        pcStack_e88 = test_bson_iter_overwrite_int32;
        test_bson_iter_as_double_cold_12();
        puVar10 = auStack_1000;
        pcStack_1088 = (code *)0x12b21d;
        puStack_e90 = auStack_e00;
        pcStack_e88 = (code *)&pcStack_c88;
        bson_init(puVar10);
        pcStack_1088 = (code *)0x12b236;
        cVar1 = bson_append_int32(puVar10,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1088 = (code *)0x12b2c6;
          test_bson_iter_overwrite_int32_cold_1();
LAB_0012b2c6:
          pcStack_1088 = (code *)0x12b2cb;
          test_bson_iter_overwrite_int32_cold_2();
LAB_0012b2cb:
          pcStack_1088 = (code *)0x12b2d0;
          test_bson_iter_overwrite_int32_cold_3();
LAB_0012b2d0:
          pcStack_1088 = (code *)0x12b2d5;
          test_bson_iter_overwrite_int32_cold_4();
LAB_0012b2d5:
          pcStack_1088 = (code *)0x12b2da;
          test_bson_iter_overwrite_int32_cold_5();
        }
        else {
          pcStack_1088 = (code *)0x12b255;
          cVar1 = bson_iter_init_find(auStack_1080,auStack_1000,"key");
          if (cVar1 == '\0') goto LAB_0012b2c6;
          pcStack_1088 = (code *)0x12b261;
          iVar2 = bson_iter_type(auStack_1080);
          if (iVar2 != 0x10) goto LAB_0012b2cb;
          pcStack_1088 = (code *)0x12b276;
          bson_iter_overwrite_int32(auStack_1080,0x10e1);
          pcStack_1088 = (code *)0x12b28d;
          cVar1 = bson_iter_init_find(auStack_1080,auStack_1000,"key");
          puVar10 = auStack_1080;
          if (cVar1 == '\0') goto LAB_0012b2d0;
          pcStack_1088 = (code *)0x12b299;
          iVar2 = bson_iter_type(auStack_1080);
          puVar10 = auStack_1080;
          if (iVar2 != 0x10) goto LAB_0012b2d5;
          pcStack_1088 = (code *)0x12b2a6;
          iVar2 = bson_iter_int32(auStack_1080);
          puVar10 = auStack_1080;
          if (iVar2 == 0x10e1) {
            pcStack_1088 = (code *)0x12b2ba;
            bson_destroy(auStack_1000);
            return;
          }
        }
        pcStack_1088 = test_bson_iter_overwrite_int64;
        test_bson_iter_overwrite_int32_cold_6();
        puVar11 = auStack_1200;
        pcStack_1288 = (code *)0x12b2ff;
        puStack_1090 = puVar10;
        pcStack_1088 = (code *)&pcStack_e88;
        bson_init(puVar11);
        pcStack_1288 = (code *)0x12b318;
        cVar1 = bson_append_int64(puVar11,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1288 = (code *)0x12b3a9;
          test_bson_iter_overwrite_int64_cold_1();
LAB_0012b3a9:
          pcStack_1288 = (code *)0x12b3ae;
          test_bson_iter_overwrite_int64_cold_2();
LAB_0012b3ae:
          pcStack_1288 = (code *)0x12b3b3;
          test_bson_iter_overwrite_int64_cold_3();
LAB_0012b3b3:
          pcStack_1288 = (code *)0x12b3b8;
          test_bson_iter_overwrite_int64_cold_4();
LAB_0012b3b8:
          pcStack_1288 = (code *)0x12b3bd;
          test_bson_iter_overwrite_int64_cold_5();
        }
        else {
          pcStack_1288 = (code *)0x12b337;
          cVar1 = bson_iter_init_find(auStack_1280,auStack_1200,"key");
          if (cVar1 == '\0') goto LAB_0012b3a9;
          pcStack_1288 = (code *)0x12b343;
          iVar2 = bson_iter_type(auStack_1280);
          if (iVar2 != 0x12) goto LAB_0012b3ae;
          pcStack_1288 = (code *)0x12b358;
          bson_iter_overwrite_int64(auStack_1280,0x1221);
          pcStack_1288 = (code *)0x12b36f;
          cVar1 = bson_iter_init_find(auStack_1280,auStack_1200,"key");
          puVar11 = auStack_1280;
          if (cVar1 == '\0') goto LAB_0012b3b3;
          pcStack_1288 = (code *)0x12b37b;
          iVar2 = bson_iter_type(auStack_1280);
          puVar11 = auStack_1280;
          if (iVar2 != 0x12) goto LAB_0012b3b8;
          pcStack_1288 = (code *)0x12b388;
          lVar7 = bson_iter_int64(auStack_1280);
          puVar11 = auStack_1280;
          if (lVar7 == 0x1221) {
            pcStack_1288 = (code *)0x12b39d;
            bson_destroy(auStack_1200);
            return;
          }
        }
        pcStack_1288 = test_bson_iter_overwrite_double;
        test_bson_iter_overwrite_int64_cold_6();
        puVar10 = auStack_1400;
        pcStack_1488 = (code *)0x12b3e2;
        puStack_1290 = puVar11;
        pcStack_1288 = (code *)&pcStack_1088;
        bson_init(puVar10);
        pcStack_1488 = (code *)0x12b3fe;
        cVar1 = bson_append_double(0x4093487e5c91d14e,puVar10,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_1488 = (code *)0x12b496;
          test_bson_iter_overwrite_double_cold_1();
LAB_0012b496:
          pcStack_1488 = (code *)0x12b49b;
          test_bson_iter_overwrite_double_cold_2();
LAB_0012b49b:
          pcStack_1488 = (code *)0x12b4a0;
          test_bson_iter_overwrite_double_cold_3();
LAB_0012b4a0:
          pcStack_1488 = (code *)0x12b4a5;
          test_bson_iter_overwrite_double_cold_4();
LAB_0012b4a5:
          pcStack_1488 = (code *)0x12b4aa;
          test_bson_iter_overwrite_double_cold_5();
        }
        else {
          pcStack_1488 = (code *)0x12b41d;
          cVar1 = bson_iter_init_find(auStack_1480,auStack_1400,"key");
          if (cVar1 == '\0') goto LAB_0012b496;
          pcStack_1488 = (code *)0x12b429;
          iVar2 = bson_iter_type(auStack_1480);
          if (iVar2 != 1) goto LAB_0012b49b;
          pcStack_1488 = (code *)0x12b441;
          bson_iter_overwrite_double(0x40b2211f97247454,auStack_1480);
          pcStack_1488 = (code *)0x12b458;
          cVar1 = bson_iter_init_find(auStack_1480,auStack_1400,"key");
          puVar10 = auStack_1480;
          if (cVar1 == '\0') goto LAB_0012b4a0;
          pcStack_1488 = (code *)0x12b464;
          iVar2 = bson_iter_type(auStack_1480);
          puVar10 = auStack_1480;
          if (iVar2 != 1) goto LAB_0012b4a5;
          pcStack_1488 = (code *)0x12b471;
          dVar19 = (double)bson_iter_double(auStack_1480);
          puVar10 = auStack_1480;
          if ((dVar19 == 4641.1234) && (puVar10 = auStack_1480, !NAN(dVar19))) {
            pcStack_1488 = (code *)0x12b48a;
            bson_destroy(auStack_1400);
            return;
          }
        }
        pcStack_1488 = test_bson_iter_overwrite_bool;
        test_bson_iter_overwrite_double_cold_6();
        puVar11 = auStack_1600;
        pcStack_1688 = (code *)0x12b4cf;
        puStack_1490 = puVar10;
        pcStack_1488 = (code *)&pcStack_1288;
        bson_init(puVar11);
        pcStack_1688 = (code *)0x12b4e8;
        cVar1 = bson_append_bool(puVar11,"key",0xffffffff,1);
        if (cVar1 == '\0') {
          pcStack_1688 = (code *)0x12b56e;
          test_bson_iter_overwrite_bool_cold_1();
LAB_0012b56e:
          pcStack_1688 = (code *)0x12b573;
          test_bson_iter_overwrite_bool_cold_2();
LAB_0012b573:
          pcStack_1688 = (code *)0x12b578;
          test_bson_iter_overwrite_bool_cold_3();
LAB_0012b578:
          pcStack_1688 = (code *)0x12b57d;
          test_bson_iter_overwrite_bool_cold_4();
LAB_0012b57d:
          pcStack_1688 = (code *)0x12b582;
          test_bson_iter_overwrite_bool_cold_5();
        }
        else {
          pcStack_1688 = (code *)0x12b503;
          cVar1 = bson_iter_init_find(auStack_1680,auStack_1600,"key");
          if (cVar1 == '\0') goto LAB_0012b56e;
          pcStack_1688 = (code *)0x12b50f;
          iVar2 = bson_iter_type(auStack_1680);
          if (iVar2 != 8) goto LAB_0012b573;
          pcStack_1688 = (code *)0x12b521;
          bson_iter_overwrite_bool(auStack_1680,0);
          pcStack_1688 = (code *)0x12b538;
          cVar1 = bson_iter_init_find(auStack_1680,auStack_1600,"key");
          puVar11 = auStack_1680;
          if (cVar1 == '\0') goto LAB_0012b578;
          pcStack_1688 = (code *)0x12b544;
          iVar2 = bson_iter_type(auStack_1680);
          puVar11 = auStack_1680;
          if (iVar2 != 8) goto LAB_0012b57d;
          pcStack_1688 = (code *)0x12b551;
          cVar1 = bson_iter_bool(auStack_1680);
          puVar11 = auStack_1680;
          if (cVar1 == '\0') {
            pcStack_1688 = (code *)0x12b562;
            bson_destroy(auStack_1600);
            return;
          }
        }
        pcStack_1688 = test_bson_iter_overwrite_decimal128;
        test_bson_iter_overwrite_bool_cold_6();
        puVar12 = &uStack_1810;
        uStack_1808 = 0;
        uStack_1810 = 1;
        uStack_1898 = 0;
        uStack_18a0 = 2;
        puVar10 = auStack_1800;
        apcStack_1908[0] = (code *)0x12b5cc;
        puStack_1698 = puVar11;
        puStack_1690 = puVar17;
        pcStack_1688 = (code *)&pcStack_1488;
        bson_init(puVar10);
        apcStack_1908[0] = (code *)0x12b5e3;
        cVar1 = bson_append_decimal128(puVar10,"key",0xffffffff,puVar12);
        if (cVar1 == '\0') {
          apcStack_1908[0] = (code *)0x12b6b3;
          test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b6b3:
          apcStack_1908[0] = (code *)0x12b6b8;
          test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b6b8:
          apcStack_1908[0] = (code *)0x12b6bd;
          test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b6bd:
          apcStack_1908[0] = (code *)0x12b6c2;
          test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b6c2:
          apcStack_1908[0] = (code *)0x12b6c7;
          test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b6c7:
          apcStack_1908[0] = (code *)0x12b6cc;
          test_bson_iter_overwrite_decimal128_cold_6();
        }
        else {
          apcStack_1908[0] = (code *)0x12b607;
          cVar1 = bson_iter_init_find(auStack_1880,auStack_1800,"key");
          if (cVar1 == '\0') goto LAB_0012b6b3;
          apcStack_1908[0] = (code *)0x12b61c;
          iVar2 = bson_iter_type(auStack_1880);
          if (iVar2 != 0x13) goto LAB_0012b6b8;
          puVar12 = auStack_1880;
          apcStack_1908[0] = (code *)0x12b63a;
          bson_iter_overwrite_decimal128(puVar12,&uStack_18a0);
          apcStack_1908[0] = (code *)0x12b651;
          cVar1 = bson_iter_init_find(puVar12,auStack_1800,"key");
          if (cVar1 == '\0') goto LAB_0012b6bd;
          apcStack_1908[0] = (code *)0x12b662;
          iVar2 = bson_iter_type(auStack_1880);
          if (iVar2 != 0x13) goto LAB_0012b6c2;
          apcStack_1908[0] = (code *)0x12b679;
          cVar1 = bson_iter_decimal128(auStack_1880,auStack_1890);
          if (cVar1 == '\0') goto LAB_0012b6c7;
          auVar21[0] = -((char)uStack_18a0 == auStack_1890[0]);
          auVar21[1] = -(uStack_18a0._1_1_ == auStack_1890[1]);
          auVar21[2] = -(uStack_18a0._2_1_ == auStack_1890[2]);
          auVar21[3] = -(uStack_18a0._3_1_ == auStack_1890[3]);
          auVar21[4] = -(uStack_18a0._4_1_ == auStack_1890[4]);
          auVar21[5] = -(uStack_18a0._5_1_ == auStack_1890[5]);
          auVar21[6] = -(uStack_18a0._6_1_ == auStack_1890[6]);
          auVar21[7] = -(uStack_18a0._7_1_ == auStack_1890[7]);
          auVar21[8] = -((char)uStack_1898 == auStack_1890[8]);
          auVar21[9] = -(uStack_1898._1_1_ == auStack_1890[9]);
          auVar21[10] = -(uStack_1898._2_1_ == auStack_1890[10]);
          auVar21[0xb] = -(uStack_1898._3_1_ == auStack_1890[0xb]);
          auVar21[0xc] = -(uStack_1898._4_1_ == auStack_1890[0xc]);
          auVar21[0xd] = -(uStack_1898._5_1_ == auStack_1890[0xd]);
          auVar21[0xe] = -(uStack_1898._6_1_ == auStack_1890[0xe]);
          auVar21[0xf] = -(uStack_1898._7_1_ == auStack_1890[0xf]);
          if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
            apcStack_1908[0] = (code *)0x12b6a5;
            bson_destroy(auStack_1800);
            return;
          }
        }
        apcStack_1908[0] = test_bson_iter_recurse;
        test_bson_iter_overwrite_decimal128_cold_7();
        pcStack_1c08 = (code *)0x12b6ee;
        puStack_1910 = puVar12;
        apcStack_1908[0] = (code *)&pcStack_1688;
        bson_init(auStack_1a80);
        pcStack_1c08 = (code *)0x12b6fe;
        bson_init(auStack_1b80);
        pcStack_1c08 = (code *)0x12b714;
        cVar1 = bson_append_int32(auStack_1b80,"0",1,0);
        if (cVar1 == '\0') {
          pcStack_1c08 = (code *)0x12b84e;
          test_bson_iter_recurse_cold_1();
LAB_0012b84e:
          pcStack_1c08 = (code *)0x12b853;
          test_bson_iter_recurse_cold_2();
LAB_0012b853:
          pcStack_1c08 = (code *)0x12b858;
          test_bson_iter_recurse_cold_3();
LAB_0012b858:
          pcStack_1c08 = (code *)0x12b85d;
          test_bson_iter_recurse_cold_4();
LAB_0012b85d:
          pcStack_1c08 = (code *)0x12b862;
          test_bson_iter_recurse_cold_5();
LAB_0012b862:
          pcStack_1c08 = (code *)0x12b867;
          test_bson_iter_recurse_cold_6();
LAB_0012b867:
          pcStack_1c08 = (code *)0x12b86c;
          test_bson_iter_recurse_cold_7();
LAB_0012b86c:
          pcStack_1c08 = (code *)0x12b871;
          test_bson_iter_recurse_cold_8();
LAB_0012b871:
          pcStack_1c08 = (code *)0x12b876;
          test_bson_iter_recurse_cold_9();
LAB_0012b876:
          pcStack_1c08 = (code *)0x12b87b;
          test_bson_iter_recurse_cold_10();
        }
        else {
          pcStack_1c08 = (code *)0x12b73a;
          cVar1 = bson_append_int32(auStack_1b80,"1",1,1);
          if (cVar1 == '\0') goto LAB_0012b84e;
          pcStack_1c08 = (code *)0x12b760;
          cVar1 = bson_append_int32(auStack_1b80,"2",1,2);
          if (cVar1 == '\0') goto LAB_0012b853;
          pcStack_1c08 = (code *)0x12b789;
          cVar1 = bson_append_array(auStack_1a80,"key",0xffffffff,auStack_1b80);
          if (cVar1 == '\0') goto LAB_0012b858;
          pcStack_1c08 = (code *)0x12b7ad;
          cVar1 = bson_iter_init_find(auStack_1b00,auStack_1a80,"key");
          if (cVar1 == '\0') goto LAB_0012b85d;
          pcStack_1c08 = (code *)0x12b7c2;
          iVar2 = bson_iter_type(auStack_1b00);
          if (iVar2 != 4) goto LAB_0012b862;
          pcStack_1c08 = (code *)0x12b7db;
          cVar1 = bson_iter_recurse(auStack_1b00,auStack_1c00);
          if (cVar1 == '\0') goto LAB_0012b867;
          pcStack_1c08 = (code *)0x12b7f2;
          cVar1 = bson_iter_find(auStack_1c00,"0");
          if (cVar1 == '\0') goto LAB_0012b86c;
          pcStack_1c08 = (code *)0x12b805;
          cVar1 = bson_iter_find(auStack_1c00,"1");
          if (cVar1 == '\0') goto LAB_0012b871;
          pcStack_1c08 = (code *)0x12b818;
          cVar1 = bson_iter_find(auStack_1c00,"2");
          if (cVar1 == '\0') goto LAB_0012b876;
          pcStack_1c08 = (code *)0x12b824;
          cVar1 = bson_iter_next(auStack_1c00);
          if (cVar1 == '\0') {
            pcStack_1c08 = (code *)0x12b835;
            bson_destroy(auStack_1a80);
            pcStack_1c08 = (code *)0x12b842;
            bson_destroy(auStack_1b80);
            return;
          }
        }
        pcStack_1c08 = test_bson_iter_init_find_case;
        test_bson_iter_recurse_cold_11();
        pcStack_1e08 = (code *)0x12b8a0;
        puStack_1c10 = auStack_1b80;
        pcStack_1c08 = (code *)apcStack_1908;
        bson_init(auStack_1d80);
        pcStack_1e08 = (code *)0x12b8b9;
        cVar1 = bson_append_int32(auStack_1d80,"FOO",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1e08 = (code *)0x12b900;
          test_bson_iter_init_find_case_cold_1();
LAB_0012b900:
          pcStack_1e08 = (code *)0x12b905;
          test_bson_iter_init_find_case_cold_2();
        }
        else {
          pcStack_1e08 = (code *)0x12b8d4;
          cVar1 = bson_iter_init_find_case(auStack_1e00,auStack_1d80,"foo");
          if (cVar1 == '\0') goto LAB_0012b900;
          pcStack_1e08 = (code *)0x12b8e0;
          iVar2 = bson_iter_int32(auStack_1e00);
          if (iVar2 == 0x4d2) {
            pcStack_1e08 = (code *)0x12b8f4;
            bson_destroy(auStack_1d80);
            return;
          }
        }
        pcStack_1e08 = test_bson_iter_find_descendant;
        test_bson_iter_init_find_case_cold_3();
        pcStack_1f88 = (code *)0x12b928;
        puStack_1e18 = auStack_1d80;
        puStack_1e10 = puVar10;
        pcStack_1e08 = (code *)&pcStack_1c08;
        pbVar6 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                         );
        pcStack_1f88 = (code *)0x12b93b;
        cVar1 = bson_iter_init(auStack_1f00,pbVar6);
        if (cVar1 == '\0') {
          pcStack_1f88 = (code *)0x12bb6c;
          test_bson_iter_find_descendant_cold_1();
LAB_0012bb6c:
          pcStack_1f88 = (code *)0x12bb71;
          test_bson_iter_find_descendant_cold_2();
LAB_0012bb71:
          pcStack_1f88 = (code *)0x12bb76;
          test_bson_iter_find_descendant_cold_3();
LAB_0012bb76:
          pcStack_1f88 = (code *)0x12bb7b;
          test_bson_iter_find_descendant_cold_4();
LAB_0012bb7b:
          pcStack_1f88 = (code *)0x12bb80;
          test_bson_iter_find_descendant_cold_5();
LAB_0012bb80:
          pcStack_1f88 = (code *)0x12bb85;
          test_bson_iter_find_descendant_cold_6();
LAB_0012bb85:
          pcStack_1f88 = (code *)0x12bb8a;
          test_bson_iter_find_descendant_cold_7();
LAB_0012bb8a:
          pcStack_1f88 = (code *)0x12bb8f;
          test_bson_iter_find_descendant_cold_8();
LAB_0012bb8f:
          pcStack_1f88 = (code *)0x12bb94;
          test_bson_iter_find_descendant_cold_9();
LAB_0012bb94:
          pcStack_1f88 = (code *)0x12bb99;
          test_bson_iter_find_descendant_cold_10();
LAB_0012bb99:
          pcStack_1f88 = (code *)0x12bb9e;
          test_bson_iter_find_descendant_cold_11();
LAB_0012bb9e:
          pcStack_1f88 = (code *)0x12bba3;
          test_bson_iter_find_descendant_cold_12();
LAB_0012bba3:
          pcStack_1f88 = (code *)0x12bba8;
          test_bson_iter_find_descendant_cold_13();
        }
        else {
          pcStack_1f88 = (code *)0x12b95a;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"a.b.c.0",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bb6c;
          pcStack_1f88 = (code *)0x12b96a;
          iVar2 = bson_iter_type(auStack_1f80);
          if (iVar2 != 0x10) goto LAB_0012bb71;
          pcStack_1f88 = (code *)0x12b97b;
          iVar2 = bson_iter_int32(auStack_1f80);
          if (iVar2 != 1) goto LAB_0012bb76;
          pcStack_1f88 = (code *)0x12b98c;
          bson_destroy(pbVar6);
          pcStack_1f88 = (code *)0x12b991;
          pbVar6 = (bson_t *)bson_bcon_magic();
          pcStack_1f88 = (code *)0x0;
          pcStack_1f90 = "}";
          pcStack_1f98 = "]";
          pbStack_1fa0 = (bson_t *)0x148ce7;
          uStack_1fa8 = 1;
          uStack_1fb0 = 0xf;
          pcStack_1fc0 = "baz";
          uStack_1fc8 = 0x12b9e0;
          pbStack_1fb8 = pbVar6;
          puVar10 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
          pcStack_1f88 = (code *)0x12b9f7;
          cVar1 = bson_iter_init(auStack_1f00,puVar10);
          if (cVar1 == '\0') goto LAB_0012bb7b;
          pcStack_1f88 = (code *)0x12ba16;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"foo.bar.0.baz",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bb80;
          pcStack_1f88 = (code *)0x12ba26;
          iVar2 = bson_iter_type(auStack_1f80);
          if (iVar2 != 0x10) goto LAB_0012bb85;
          pcStack_1f88 = (code *)0x12ba37;
          iVar2 = bson_iter_int32(auStack_1f80);
          if (iVar2 != 1) goto LAB_0012bb8a;
          pcStack_1f88 = (code *)0x12ba48;
          bson_destroy(puVar10);
          pcStack_1f88 = (code *)0x0;
          pcStack_1f90 = (char *)0x2;
          pcStack_1f98 = (char *)0xf;
          uStack_1fa8 = 0x12ba74;
          pbStack_1fa0 = pbVar6;
          puVar10 = (undefined1 *)bcon_new(0,"nModified",pbVar6,0xf,1,"n");
          pcStack_1f88 = (code *)0x12ba8b;
          cVar1 = bson_iter_init(auStack_1f00,puVar10);
          if (cVar1 == '\0') goto LAB_0012bb8f;
          pcStack_1f88 = (code *)0x12baaa;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"n",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bb94;
          pcStack_1f88 = (code *)0x12baba;
          pcVar5 = (char *)bson_iter_key(auStack_1f80);
          pcStack_1f88 = (code *)0x12bac9;
          iVar2 = strcmp(pcVar5,"n");
          if (iVar2 != 0) goto LAB_0012bb99;
          pcStack_1f88 = (code *)0x12bad9;
          bson_destroy(puVar10);
          pcStack_1f88 = (code *)0x0;
          pcStack_1f90 = (char *)0x2;
          pcStack_1f98 = (char *)0xf;
          uStack_1fa8 = 0x12bb05;
          pbStack_1fa0 = pbVar6;
          pbVar6 = (bson_t *)bcon_new(0,"",pbVar6,0xf,1,"n");
          pcStack_1f88 = (code *)0x12bb1c;
          cVar1 = bson_iter_init(auStack_1f00,pbVar6);
          if (cVar1 == '\0') goto LAB_0012bb9e;
          pcStack_1f88 = (code *)0x12bb37;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"n",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bba3;
          pcStack_1f88 = (code *)0x12bb43;
          pcVar5 = (char *)bson_iter_key(auStack_1f80);
          pcStack_1f88 = (code *)0x12bb52;
          iVar2 = strcmp(pcVar5,"n");
          if (iVar2 == 0) {
            pcStack_1f88 = (code *)0x12bb5e;
            bson_destroy(pbVar6);
            return;
          }
        }
        pcStack_1f88 = test_bson_iter_as_bool;
        test_bson_iter_find_descendant_cold_14();
        pbVar14 = &bStack_2180;
        pbVar15 = &bStack_2180;
        pbVar8 = &bStack_2180;
        pbVar13 = abStack_2100;
        pcStack_2188 = (code *)0x12bbd1;
        pbStack_1fa0 = pbVar6;
        pcStack_1f98 = puVar10;
        pcStack_1f90 = (char *)uVar18;
        pcStack_1f88 = (code *)&pcStack_1e08;
        bson_init(pbVar13);
        pcStack_2188 = (code *)0x12bbea;
        bson_append_int32(pbVar13,"int32[true]",0xffffffff,1);
        pcStack_2188 = (code *)0x12bc00;
        bson_append_int32(pbVar13,"int32[false]",0xffffffff,0);
        pcStack_2188 = (code *)0x12bc1c;
        bson_append_int64(pbVar13,"int64[true]",0xffffffff,1);
        pcStack_2188 = (code *)0x12bc35;
        bson_append_int64(pbVar13,"int64[false]",0xffffffff,0);
        pcStack_2188 = (code *)0x12bc4d;
        bson_append_double(0x3ff0000000000000,pbVar13,"int64[true]",0xffffffff);
        pcStack_2188 = (code *)0x12bc60;
        bson_append_double(pbVar13,"int64[false]",0xffffffff);
        pcStack_2188 = (code *)0x12bc6e;
        bson_iter_init(&bStack_2180,pbVar13);
        pcStack_2188 = (code *)0x12bc76;
        bson_iter_next(&bStack_2180);
        pcStack_2188 = (code *)0x12bc7e;
        cVar1 = bson_iter_as_bool(&bStack_2180);
        if (cVar1 == '\0') {
          pcStack_2188 = (code *)0x12bd16;
          test_bson_iter_as_bool_cold_1();
LAB_0012bd16:
          pcStack_2188 = (code *)0x12bd1b;
          test_bson_iter_as_bool_cold_6();
LAB_0012bd1b:
          pbVar14 = pbVar13;
          pcStack_2188 = (code *)0x12bd20;
          test_bson_iter_as_bool_cold_2();
LAB_0012bd20:
          pcStack_2188 = (code *)0x12bd25;
          test_bson_iter_as_bool_cold_5();
LAB_0012bd25:
          pbVar15 = pbVar14;
          pcStack_2188 = (code *)0x12bd2a;
          test_bson_iter_as_bool_cold_3();
        }
        else {
          pcStack_2188 = (code *)0x12bc91;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bc99;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          pbVar13 = &bStack_2180;
          if (cVar1 != '\0') goto LAB_0012bd16;
          pcStack_2188 = (code *)0x12bca8;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bcb0;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          pbVar13 = &bStack_2180;
          if (cVar1 == '\0') goto LAB_0012bd1b;
          pcStack_2188 = (code *)0x12bcbf;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bcc7;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          if (cVar1 != '\0') goto LAB_0012bd20;
          pcStack_2188 = (code *)0x12bcd6;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bcde;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          pbVar14 = &bStack_2180;
          if (cVar1 == '\0') goto LAB_0012bd25;
          pcStack_2188 = (code *)0x12bced;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bcf5;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          if (cVar1 == '\0') {
            pcStack_2188 = (code *)0x12bd06;
            bson_destroy(abStack_2100);
            return;
          }
        }
        pcStack_2188 = test_bson_iter_binary_deprecated;
        test_bson_iter_as_bool_cold_4();
        pcStack_2308 = (code *)0x12bd4d;
        pbStack_2198 = pbVar15;
        puStack_2190 = (undefined1 *)&bStack_2180;
        pcStack_2188 = (code *)&pcStack_1f88;
        pbVar6 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                         );
        if (pbVar6 == (bson_t *)0x0) {
          pcStack_2308 = (code *)0x12bdc2;
          test_bson_iter_binary_deprecated_cold_5();
LAB_0012bdc2:
          pcStack_2308 = (code *)0x12bdc7;
          test_bson_iter_binary_deprecated_cold_1();
LAB_0012bdc7:
          pcStack_2308 = (code *)0x12bdcc;
          test_bson_iter_binary_deprecated_cold_2();
LAB_0012bdcc:
          pcStack_2308 = (code *)0x12bdd1;
          test_bson_iter_binary_deprecated_cold_3();
        }
        else {
          pcStack_2308 = (code *)0x12bd65;
          cVar1 = bson_iter_init(auStack_2280,pbVar6);
          pbVar15 = pbVar6;
          if (cVar1 == '\0') goto LAB_0012bdc2;
          pcStack_2308 = (code *)0x12bd76;
          cVar1 = bson_iter_next(auStack_2280);
          if (cVar1 == '\0') goto LAB_0012bdc7;
          pbVar8 = (bson_t *)&iStack_2288;
          pcStack_2308 = (code *)0x12bd99;
          bson_iter_binary(auStack_2280,auStack_2284,pbVar8,&piStack_2290);
          if (iStack_2288 != 4) goto LAB_0012bdcc;
          if (*piStack_2290 == 0x34333231) {
            pcStack_2308 = (code *)0x12bdb4;
            bson_destroy(pbVar6);
            return;
          }
        }
        pcStack_2308 = test_bson_iter_from_data;
        test_bson_iter_binary_deprecated_cold_4();
        uStack_2410 = 0x100620800000009;
        uStack_2408 = 0;
        suite = aTStack_2400;
        pcStack_2488 = (code *)0x12be0d;
        pcStack_2308 = (code *)&pcStack_2188;
        cVar1 = bson_iter_init_from_data(suite,&uStack_2410,9);
        if (cVar1 == '\0') {
          pcStack_2488 = (code *)0x12be4f;
          test_bson_iter_from_data_cold_1();
LAB_0012be4f:
          pcStack_2488 = (code *)0x12be54;
          test_bson_iter_from_data_cold_2();
LAB_0012be54:
          pcStack_2488 = (code *)0x12be59;
          test_bson_iter_from_data_cold_3();
        }
        else {
          suite = aTStack_2400;
          pcStack_2488 = (code *)0x12be1e;
          cVar1 = bson_iter_next();
          if (cVar1 == '\0') goto LAB_0012be4f;
          suite = aTStack_2400;
          pcStack_2488 = (code *)0x12be2f;
          iVar2 = bson_iter_type();
          if (iVar2 != 8) goto LAB_0012be54;
          suite = aTStack_2400;
          pcStack_2488 = (code *)0x12be41;
          cVar1 = bson_iter_bool();
          if (cVar1 != '\0') {
            return;
          }
        }
        pcStack_2488 = get_bson;
        test_bson_iter_from_data_cold_4();
        pbStack_2490 = pbVar15;
        pcStack_2488 = (code *)pbVar8;
        iVar2 = open((char *)suite,0);
        if (iVar2 != -1) {
          uVar18 = read(iVar2,auStack_3498,0x1000);
          if ((long)uVar18 < 0) goto LAB_0012bec0;
          if (uVar18 != 0) {
            bson_new_from_data(auStack_3498,uVar18 & 0xffffffff);
            close(iVar2);
            return;
          }
          get_bson_cold_1();
        }
        get_bson_cold_3();
LAB_0012bec0:
        get_bson_cold_2();
        TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
        TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
        TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
        TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
        TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
        TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
        TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
        TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
        TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
        TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
        TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
        TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
        TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                      test_bson_as_canonical_extended_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
        TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
        TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
        TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
        TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
        TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
        TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
        TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
        TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
        TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
        TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
        TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
        TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
        TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
        TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
        TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
        TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
        TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
        TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
        TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
        TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
        TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
        TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
        TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
        TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
        TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
        TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
        TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
        TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
        TestSuite_Add(suite,"/bson/json/read/regex_options_order",
                      test_bson_json_read_regex_options_order);
        TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
        TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
        TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
        TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
        TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
        TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
        TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
        TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
        TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
        TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
        TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
        TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
        TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
        TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
        TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
        TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
        TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
        TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
        TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
        TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
        TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
        TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
        TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
        TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
        TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
        TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
        return;
      }
LAB_0012ac9f:
      apcStack_888[0] = (code *)0x12aca7;
      cVar1 = bson_iter_next(auStack_800);
      if (cVar1 != '\0') {
        if (uStack_7d8 < 0x200) {
          apcStack_888[0] = (code *)0x12acc8;
          uVar3 = bson_iter_type(auStack_800);
          if (uVar3 < 0x14) break;
          goto LAB_0012ad71;
        }
        apcStack_888[0] = (code *)0x12adbb;
        test_bson_iter_fuzz_cold_2();
        goto LAB_0012adbb;
      }
      apcStack_888[0] = (code *)0x12ad8f;
      bson_destroy(lVar7);
    }
    apcStack_888[0] = (code *)0x12ad97;
    bson_free(puVar9);
    uVar3 = (int)puVar17 + 1;
    puVar17 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 100000) {
      return;
    }
  } while( true );
  if ((0xfff66U >> (uVar3 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 7) {
        if (uStack_7f8 <= iStack_7f4 + 0xcU) goto LAB_0012add9;
      }
      else {
LAB_0012ad71:
        if ((uVar3 != 0x7f) && (uVar3 != 0xff)) goto LAB_0012adde;
      }
    }
    else {
      puStack_808 = (uint *)0x0;
      uStack_80c = 0;
      apcStack_888[0] = (code *)0x12ad04;
      bson_iter_document(auStack_800,&uStack_80c,&puStack_808);
      if (uStack_80c != 0) {
        if (puStack_808 == (uint *)0x0) goto LAB_0012adc0;
        if (uStack_80c < 5) goto LAB_0012adc5;
        if (*(uint *)(lVar7 + 4) <= iStack_7f4 + uStack_80c) goto LAB_0012adca;
        if (uStack_80c == 0xffffffff) goto LAB_0012adcf;
        uStack_80c = *puStack_808;
        if (uStack_80c < 5) goto LAB_0012add4;
      }
    }
  }
  goto LAB_0012ac9f;
}

Assistant:

static void
test_bson_iter_utf8 (void)
{
   uint32_t len = 0;
   bson_iter_t iter;
   bson_t *b;
   char *s;

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "foo", -1, "bar", -1));
   BSON_ASSERT (bson_append_utf8 (b, "bar", -1, "baz", -1));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "foo"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "bar"));
   s = bson_iter_dup_utf8 (&iter, &len);
   BSON_ASSERT_CMPSTR ("bar", s);
   BSON_ASSERT_CMPINT (len, ==, 3);
   bson_free (s);
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "bar"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "baz"));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}